

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HinOut.cpp
# Opt level: O0

void __thiscall HinOut::clearData(HinOut *this)

{
  undefined4 *in_RDI;
  
  in_RDI[1] = 0;
  *in_RDI = 0;
  in_RDI[4] = 0;
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1bbe10);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1bbe1e);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x1bbe2c);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x1bbe3a);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x1bbe48);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x1bbe59);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x1bbe6a);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x1bbe7b);
  in_RDI[0x1ea] = 0;
  return;
}

Assistant:

void HinOut::clearData() {
	numRow = 0;
	numCol = 0;
	numTot = 0;
	Astart.clear();
	Aindex.clear();
	Avalue.clear();

	colCost.clear();
	colLower.clear();
	colUpper.clear();
	rowLower.clear();
	rowUpper.clear();

	AcountX = 0;
}